

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_extswsli1(DisasContext_conflict10 *ctx)

{
  gen_extswsli(ctx,1);
  return;
}

Assistant:

static void gen_extswsli1(DisasContext *ctx)
{
    gen_extswsli(ctx, 1);
}